

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O0

void __thiscall
gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::clear
          (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *this)

{
  void *__s;
  store_t sVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long in_RDI;
  long i;
  long pn;
  store_t inv;
  undefined8 in_stack_ffffffffffffffd0;
  undefined8 local_20;
  
  PixelTraits<unsigned_char>::invalid();
  sVar1 = PixelTraits<unsigned_char>::limit((work_t)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
  if (sVar1 == '\0') {
    __s = *(void **)(in_RDI + 0x20);
    iVar2 = std::abs((int)*(undefined8 *)(in_RDI + 0x18));
    memset(__s,0,CONCAT44(extraout_var,iVar2));
  }
  else {
    iVar2 = std::abs((int)*(undefined8 *)(in_RDI + 0x18));
    for (local_20 = 0; local_20 < CONCAT44(extraout_var_00,iVar2); local_20 = local_20 + 1) {
      *(store_t *)(*(long *)(in_RDI + 0x20) + local_20) = sVar1;
    }
  }
  return;
}

Assistant:

void clear()
    {
      store_t inv=ptraits::limit(ptraits::invalid());

      if (inv == 0)
      {
        memset(pixel, 0, std::abs(n)*sizeof(T));
      }
      else
      {
        long pn=std::abs(n);
        for (long i=0; i<pn; i++)
        {
          pixel[i]=inv;
        }
      }
    }